

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

void __thiscall Assimp::FBX::MeshGeometry::~MeshGeometry(MeshGeometry *this)

{
  long *plVar1;
  pointer puVar2;
  void *pvVar3;
  long *plVar4;
  pointer paVar5;
  pointer piVar6;
  long lVar7;
  
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__MeshGeometry_008f3830;
  puVar2 = (this->m_mappings).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_mappings).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->m_mapping_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_mapping_offsets).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->m_mapping_counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_mapping_counts).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  lVar7 = 0x378;
  do {
    pvVar3 = *(void **)((long)this + lVar7 + -0x10);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)&(this->super_Geometry).super_Object._vptr_Object +
                                      lVar7) - (long)pvVar3);
    }
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != 0x2b8);
  lVar7 = 0x2b8;
  do {
    pvVar3 = *(void **)((long)this + lVar7 + -0x10);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)&(this->super_Geometry).super_Object._vptr_Object +
                                      lVar7) - (long)pvVar3);
    }
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != 0x1f8);
  lVar7 = 0x1f0;
  do {
    plVar1 = (long *)((long)&(this->super_Geometry).super_Object._vptr_Object + lVar7);
    plVar4 = *(long **)((long)this + lVar7 + -0x10);
    if (plVar1 != plVar4) {
      operator_delete(plVar4,*plVar1 + 1);
    }
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != 0xf0);
  paVar5 = (this->m_normals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar5 != (pointer)0x0) {
    operator_delete(paVar5,(long)(this->m_normals).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar5);
  }
  paVar5 = (this->m_binormals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar5 != (pointer)0x0) {
    operator_delete(paVar5,(long)(this->m_binormals).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar5);
  }
  paVar5 = (this->m_tangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar5 != (pointer)0x0) {
    operator_delete(paVar5,(long)(this->m_tangents).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar5);
  }
  puVar2 = (this->m_facesVertexStartIndices).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_facesVertexStartIndices).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_faces).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  paVar5 = (this->m_vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar5 != (pointer)0x0) {
    operator_delete(paVar5,(long)(this->m_vertices).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar5);
  }
  piVar6 = (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar6 != (pointer)0x0) {
    operator_delete(piVar6,(long)(this->m_materials).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar6);
  }
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

MeshGeometry::~MeshGeometry() {
    // empty
}